

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

xmlDocPtr xmlCtxtGetDocument(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlDocPtr pxVar2;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return (xmlDocPtr)0x0;
  }
  if (ctxt->wellFormed == 0) {
    if ((ctxt->recovery != 0) || (ctxt->html != 0)) {
      iVar1 = xmlIsCatastrophicError((ctxt->lastError).level,(ctxt->lastError).code);
      if (iVar1 == 0) goto LAB_0014491f;
    }
    if (ctxt->errNo == 0) {
      xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"unknown error");
    }
    xmlFreeDoc(ctxt->myDoc);
    pxVar2 = (xmlDocPtr)0x0;
  }
  else {
LAB_0014491f:
    pxVar2 = ctxt->myDoc;
  }
  ctxt->myDoc = (xmlDocPtr)0x0;
  return pxVar2;
}

Assistant:

xmlDocPtr
xmlCtxtGetDocument(xmlParserCtxtPtr ctxt) {
    xmlDocPtr doc;

    if (ctxt == NULL)
        return(NULL);

    if ((ctxt->wellFormed) ||
        (((ctxt->recovery) || (ctxt->html)) &&
         (!xmlCtxtIsCatastrophicError(ctxt)))) {
        doc = ctxt->myDoc;
    } else {
        if (ctxt->errNo == XML_ERR_OK)
            xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR, "unknown error");
        doc = NULL;
        xmlFreeDoc(ctxt->myDoc);
    }
    ctxt->myDoc = NULL;

    return(doc);
}